

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O0

int client_setup_ech(st_ptls_ech_t *ech,st_decoded_ech_config_t *decoded,
                    _func_void_void_ptr_size_t *random_bytes)

{
  ptls_hpke_kem_t *kem;
  ptls_hpke_cipher_suite_t *cipher;
  char *pcVar1;
  ptls_iovec_t info;
  int local_14c;
  undefined1 local_148 [4];
  int ret;
  uint8_t infobuf_smallbuf [256];
  undefined1 local_40 [8];
  ptls_buffer_t infobuf;
  _func_void_void_ptr_size_t *random_bytes_local;
  st_decoded_ech_config_t *decoded_local;
  st_ptls_ech_t *ech_local;
  
  infobuf._24_8_ = random_bytes;
  ptls_buffer_init((ptls_buffer_t *)local_40,local_148,0x100);
  local_14c = ptls_buffer__do_pushv((ptls_buffer_t *)local_40,"tls ech",8);
  if ((local_14c == 0) &&
     (local_14c = ptls_buffer__do_pushv
                            ((ptls_buffer_t *)local_40,(decoded->bytes).base,(decoded->bytes).len),
     local_14c == 0)) {
    kem = decoded->kem;
    cipher = decoded->cipher;
    info = ptls_iovec_init((void *)local_40,infobuf.capacity);
    local_14c = ptls_hpke_setup_base_s
                          (kem,cipher,&(ech->client).enc,&ech->aead,decoded->public_key,info);
    if (local_14c == 0) {
      ech->config_id = decoded->id;
      ech->kem = decoded->kem;
      ech->cipher = decoded->cipher;
      (*(code *)infobuf._24_8_)(ech->inner_client_random,0x20);
      (ech->client).max_name_length = decoded->max_name_length;
      pcVar1 = duplicate_as_str((decoded->public_name).base,(decoded->public_name).len);
      (ech->client).public_name = pcVar1;
      if (pcVar1 == (char *)0x0) {
        local_14c = 0x201;
      }
    }
  }
  if (local_14c != 0) {
    clear_ech(ech,0);
  }
  return local_14c;
}

Assistant:

static int client_setup_ech(struct st_ptls_ech_t *ech, struct st_decoded_ech_config_t *decoded,
                            void (*random_bytes)(void *, size_t))
{
    ptls_buffer_t infobuf;
    uint8_t infobuf_smallbuf[256];
    int ret;

    /* setup `enc` and `aead` by running HPKE */
    ptls_buffer_init(&infobuf, infobuf_smallbuf, sizeof(infobuf_smallbuf));
    ptls_buffer_pushv(&infobuf, ech_info_prefix, sizeof(ech_info_prefix));
    ptls_buffer_pushv(&infobuf, decoded->bytes.base, decoded->bytes.len);
    if ((ret = ptls_hpke_setup_base_s(decoded->kem, decoded->cipher, &ech->client.enc, &ech->aead, decoded->public_key,
                                      ptls_iovec_init(infobuf.base, infobuf.off))) != 0)
        goto Exit;

    /* setup the rest */
    ech->config_id = decoded->id;
    ech->kem = decoded->kem;
    ech->cipher = decoded->cipher;
    random_bytes(ech->inner_client_random, PTLS_HELLO_RANDOM_SIZE);
    ech->client.max_name_length = decoded->max_name_length;
    if ((ech->client.public_name = duplicate_as_str(decoded->public_name.base, decoded->public_name.len)) == NULL) {
        ret = PTLS_ERROR_NO_MEMORY;
        goto Exit;
    }

Exit:
    if (ret != 0)
        clear_ech(ech, 0);
    return ret;
}